

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O0

void proxy_update_registration(proxy_handle *ph)

{
  uint uVar1;
  void *pvVar2;
  uint local_24;
  int slots_total;
  int slots_used;
  proxy_worker *pw;
  proxy_priv *priv;
  proxy_handle *ph_local;
  
  pvVar2 = ph->priv;
  mutex_lock_shared((mutex_handle *)((long)pvVar2 + 0x870));
  uVar1 = *(uint *)((long)pvVar2 + 0x83c);
  local_24 = *(uint *)((long)pvVar2 + 0x838);
  mutex_unlock_shared((mutex_handle *)((long)pvVar2 + 0x870));
  mutex_lock_shared((mutex_handle *)((long)pvVar2 + 0x880));
  for (_slots_total = *(long *)((long)pvVar2 + 0x820); _slots_total != 0;
      _slots_total = *(long *)(_slots_total + 0x10)) {
    local_24 = local_24 - 1;
  }
  mutex_unlock_shared((mutex_handle *)((long)pvVar2 + 0x880));
  proxy_log(ph,LOG_LEVEL_DEBUG,"Sending update to registrar (%d/%d)\n",(ulong)local_24,(ulong)uVar1)
  ;
  registration_service_update
            ((registration_service_handle *)((long)pvVar2 + 0x888),(long)(int)local_24,
             (long)(int)uVar1);
  return;
}

Assistant:

void proxy_update_registration(struct proxy_handle *ph)
{
	struct proxy_priv *priv = ph->priv;
	struct proxy_worker *pw;
	int slots_used;
	int slots_total;

	mutex_lock_shared(&priv->usable_clients_mutex);
	slots_total = priv->usable_clients;
	slots_used = priv->num_clients;
	mutex_unlock_shared(&priv->usable_clients_mutex);

	mutex_lock_shared(&priv->idle_workers_mutex);
	for (pw = priv->idle_workers_head; pw != NULL; pw = pw->next)
		slots_used--;
	mutex_unlock_shared(&priv->idle_workers_mutex);

	proxy_log(ph, LOG_LEVEL_DEBUG,
		  "Sending update to registrar (%d/%d)\n",
		  slots_used, slots_total);

	registration_service_update(&priv->reg_service, slots_used,
				    slots_total);
}